

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  Result RVar1;
  Enum EVar2;
  LocalDesc local_2c;
  
  RVar1 = SharedValidator::OnLocalDecl
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     count,type);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    local_2c.end = this->local_count_ + count;
    this->local_count_ = local_2c.end;
    local_2c.type.enum_ = type.enum_;
    local_2c.count = count;
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::
    emplace_back<wabt::interp::LocalDesc>(&this->func_->locals,&local_2c);
    EVar2 = Ok;
    if (this->local_decl_count_ - 1 == decl_index) {
      Istream::Emit(this->istream_,InterpAlloca,this->local_count_);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(loc, count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});

  if (decl_index == local_decl_count_ - 1) {
    istream_.Emit(Opcode::InterpAlloca, local_count_);
  }
  return Result::Ok;
}